

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDefines.h
# Opt level: O2

void __thiscall KDIS::KException::KException(KException *this,KUINT16 EC)

{
  undefined6 in_register_00000032;
  KString *this_00;
  allocator<char> local_1e;
  allocator<char> local_1d;
  allocator<char> local_1c;
  allocator<char> local_1b;
  allocator<char> local_1a;
  allocator<char> local_19;
  allocator<char> local_18;
  allocator<char> local_17;
  allocator<char> local_16;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  
  *(undefined ***)this = &PTR__KException_00211c38;
  this->m_ui16ErrorCode = EC;
  this_00 = &this->m_sErrorText;
  switch(CONCAT62(in_register_00000032,EC) & 0xffffffff) {
  case 0:
    std::__cxx11::string::string<std::allocator<char>>((string *)this_00,"No Errors. ",&local_11);
    break;
  case 1:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this_00,"Buffer Is Too Small. ",&local_12);
    break;
  case 2:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this_00,"Buffer Does Not Contain Enough Information To Decode. ",&local_13)
    ;
    break;
  case 3:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this_00,"String Size Too Big. ",&local_14);
    break;
  case 4:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this_00,"Data Type Is Too Large. ",&local_15);
    break;
  case 5:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this_00,"Incorrect PDU Type Specified In Header. ",&local_16);
    break;
  case 6:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this_00,"Could Not Open File For Reading/Writing. ",&local_17);
    break;
  case 7:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this_00,"Parameter Is Out Of Bounds/Range Of Acceptable Values. ",&local_18
              );
    break;
  case 8:
    std::__cxx11::string::string<std::allocator<char>>((string *)this_00,"Invalid Data. ",&local_19)
    ;
    break;
  case 9:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this_00,"Unsupported Data Type, Can Not Decode. ",&local_1a);
    break;
  case 10:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this_00,"Invalid Operation. ",&local_1b);
    break;
  case 0xb:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this_00,"PDU Is Too Large. PDU Must Not Exceed 8192 Bytes.",&local_1c);
    break;
  case 0xc:
    std::__cxx11::string::string<std::allocator<char>>((string *)this_00,"Socket error.",&local_1d);
    break;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this_00,"Unknown KDIS Error. ",&local_1e);
  }
  return;
}

Assistant:

explicit KException(KUINT16 EC) :
        m_ui16ErrorCode( EC ),
        m_sErrorText( GetErrorText( EC ) )
    {
    }